

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

Def * cmDefinitions::GetInternal(string *key,StackIter begin,StackIter end,bool raise)

{
  StackIter end_00;
  StackIter begin_00;
  iterator other;
  bool bVar1;
  PointerType pcVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
  _Var4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_false,_true>,_bool>
  pVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>
  local_100;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
  local_b8;
  undefined1 local_b0;
  __node_type *local_a8;
  cmLinkedTree<cmDefinitions> *local_a0;
  cmLinkedTree<cmDefinitions> *local_98;
  cmLinkedTree<cmDefinitions> *local_90;
  Def *local_88;
  Def *def;
  cmLinkedTree<cmDefinitions> *local_78;
  undefined1 local_70 [8];
  StackIter it;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
  local_58;
  iterator i;
  bool raise_local;
  string *key_local;
  StackIter end_local;
  StackIter begin_local;
  
  end_local.Position = (PositionType)begin.Tree;
  end_local.Tree = (cmLinkedTree<cmDefinitions> *)end.Position;
  _Var4._M_cur = (__node_type *)end.Tree;
  i.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
               )_Var4._M_cur;
  bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=((iterator *)&end_local.Position,end);
  if (bVar1) {
    pcVar2 = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)&end_local.Position);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>_>
         ::find(&pcVar2->Map,key);
    pcVar2 = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)&end_local.Position);
    it.Position = (PositionType)
                  std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>_>
                  ::end(&pcVar2->Map);
    bVar1 = std::__detail::operator!=
                      (&local_58,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
                        *)&it.Position);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_false,_true>
                             *)&local_58);
      (ppVar3->second).Used = true;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_false,_true>
                             *)&local_58);
      begin_local.Position = (PositionType)&ppVar3->second;
    }
    else {
      local_70 = (undefined1  [8])end_local.Position;
      it.Tree = (cmLinkedTree<cmDefinitions> *)begin.Position;
      cmLinkedTree<cmDefinitions>::iterator::operator++((iterator *)local_70);
      local_78 = end_local.Tree;
      other.Position = (PositionType)end_local.Tree;
      other.Tree = (cmLinkedTree<cmDefinitions> *)_Var4._M_cur;
      def = (Def *)_Var4._M_cur;
      bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator==((iterator *)local_70,other);
      if (bVar1) {
        begin_local.Position = (PositionType)&NoDef;
      }
      else {
        local_98 = (cmLinkedTree<cmDefinitions> *)local_70;
        local_90 = it.Tree;
        local_a0 = end_local.Tree;
        begin_00.Position = (PositionType)it.Tree;
        begin_00.Tree = (cmLinkedTree<cmDefinitions> *)local_70;
        end_00.Position = (PositionType)end_local.Tree;
        end_00.Tree = (cmLinkedTree<cmDefinitions> *)_Var4._M_cur;
        local_a8 = _Var4._M_cur;
        local_88 = GetInternal(key,begin_00,end_00,raise);
        begin_local.Position = (PositionType)local_88;
        if (raise) {
          pcVar2 = cmLinkedTree<cmDefinitions>::iterator::operator->
                             ((iterator *)&end_local.Position);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>
          ::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def,_true>
                    (&local_100,key,local_88);
          pVar5 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>_>
                  ::insert(&pcVar2->Map,&local_100);
          local_b8._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
               ._M_cur;
          local_b0 = pVar5.second;
          ppVar3 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_false,_true>
                                 *)&local_b8);
          begin_local.Position = (PositionType)&ppVar3->second;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>
          ::~pair(&local_100);
        }
      }
    }
    return (Def *)begin_local.Position;
  }
  __assert_fail("begin != end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmDefinitions.cxx"
                ,0xf,
                "static const cmDefinitions::Def &cmDefinitions::GetInternal(const std::string &, StackIter, StackIter, bool)"
               );
}

Assistant:

cmDefinitions::Def const& cmDefinitions::GetInternal(const std::string& key,
                                                     StackIter begin,
                                                     StackIter end, bool raise)
{
  assert(begin != end);
  MapType::iterator i = begin->Map.find(key);
  if (i != begin->Map.end()) {
    i->second.Used = true;
    return i->second;
  }
  StackIter it = begin;
  ++it;
  if (it == end) {
    return cmDefinitions::NoDef;
  }
  Def const& def = cmDefinitions::GetInternal(key, it, end, raise);
  if (!raise) {
    return def;
  }
  return begin->Map.insert(MapType::value_type(key, def)).first->second;
}